

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sensors.cpp
# Opt level: O3

void __thiscall SensorBase::enable_buffer(SensorBase *this)

{
  path buffer_enable_path;
  path local_b0;
  path local_88;
  path local_60;
  path local_38;
  
  std::filesystem::__cxx11::path::path<char[7],std::filesystem::__cxx11::path>
            (&local_38,(char (*) [7])"buffer",auto_format);
  std::filesystem::__cxx11::operator/(&local_88,&this->sysfspath,&local_38);
  std::filesystem::__cxx11::path::path<char[7],std::filesystem::__cxx11::path>
            (&local_b0,(char (*) [7])"enable",auto_format);
  std::filesystem::__cxx11::operator/(&local_60,&local_88,&local_b0);
  std::filesystem::__cxx11::path::~path(&local_b0);
  std::filesystem::__cxx11::path::~path(&local_88);
  std::filesystem::__cxx11::path::~path(&local_38);
  writeint(local_60._M_pathname._M_dataplus._M_p,1);
  std::filesystem::__cxx11::path::~path(&local_60);
  return;
}

Assistant:

void SensorBase::enable_buffer()
{
	using filesystem::path;
	
	path buffer_enable_path=sysfspath/"buffer"/"enable";
	writeint(buffer_enable_path.c_str(),1);
}